

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacNtk.c
# Opt level: O1

void Bac_ManAssignInternWordNames(Bac_Man_t *p)

{
  uint uVar1;
  Vec_Int_t *vMap;
  int *__s;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  
  if (p->nNtks < 1) {
    iVar5 = 0;
  }
  else {
    lVar3 = 0;
    iVar5 = 0;
    do {
      iVar5 = iVar5 + *(int *)((long)&p->pNtks[1].vType.nSize + lVar3);
      lVar3 = lVar3 + 0xd0;
    } while ((ulong)(uint)p->nNtks * 0xd0 - lVar3 != 0);
  }
  uVar1 = iVar5 * 2;
  vMap = (Vec_Int_t *)malloc(0x10);
  uVar2 = 0x10;
  if (0xe < iVar5 * 2 - 1U) {
    uVar2 = uVar1;
  }
  vMap->nSize = 0;
  vMap->nCap = uVar2;
  if (uVar2 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)(int)uVar2 << 2);
  }
  vMap->pArray = __s;
  vMap->nSize = uVar1;
  if (__s != (int *)0x0) {
    memset(__s,0,(long)(int)uVar1 << 2);
  }
  if (0 < p->nNtks) {
    lVar6 = 0xd0;
    lVar3 = 0;
    do {
      Bac_ManAssignInternWordNamesNtk((Bac_Ntk_t *)((long)&p->pNtks->pDesign + lVar6),vMap);
      lVar3 = lVar3 + 1;
      lVar6 = lVar6 + 0xd0;
    } while (lVar3 < p->nNtks);
  }
  if (iVar5 < 1) {
    uVar2 = 0;
  }
  else {
    uVar4 = 0;
    uVar2 = 0;
    do {
      uVar2 = uVar2 + (__s[uVar4] == 0);
      uVar4 = uVar4 + 1;
    } while (uVar1 != uVar4);
  }
  if (uVar2 != uVar1) {
    __assert_fail("Vec_IntCountEntry(vMap, 0) == Vec_IntSize(vMap)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacNtk.c"
                  ,0x18e,"void Bac_ManAssignInternWordNames(Bac_Man_t *)");
  }
  if (__s != (int *)0x0) {
    free(__s);
    vMap->pArray = (int *)0x0;
  }
  free(vMap);
  return;
}

Assistant:

void Bac_ManAssignInternWordNames( Bac_Man_t * p )
{
    Vec_Int_t * vMap = Vec_IntStart( 2*Bac_ManObjNum(p) );
    Bac_Ntk_t * pNtk; int i;
    Bac_ManForEachNtk( p, pNtk, i )
        Bac_ManAssignInternWordNamesNtk( pNtk, vMap );
    assert( Vec_IntCountEntry(vMap, 0) == Vec_IntSize(vMap) );
    Vec_IntFree( vMap );
}